

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qselect.c
# Opt level: O3

double dqselect(int n,double *A,int k)

{
  double dVar1;
  double dVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar6;
  
  if (1 < n) {
    if (k < 1) {
      k = 0;
    }
    if (n - 1U <= (uint)k) {
      k = n - 1U;
    }
    do {
      uVar5 = n - 1;
      uVar6 = (ulong)uVar5;
      dVar1 = A[uVar6];
      lVar8 = 0;
      do {
        lVar3 = (long)(int)uVar6;
        lVar9 = (lVar8 << 0x20) + -0x100000000;
        uVar4 = (int)lVar8 - 1;
        lVar10 = (long)(int)lVar8;
        do {
          lVar8 = lVar10;
          lVar9 = lVar9 + 0x100000000;
          dVar2 = A[lVar8];
          uVar4 = uVar4 + 1;
          if (dVar2 < dVar1) break;
          lVar10 = lVar8 + 1;
        } while (lVar8 < lVar3);
        if (dVar2 < dVar1) {
          A[lVar3] = dVar2;
          lVar3 = lVar9 >> 0x20;
          uVar6 = (ulong)uVar4;
        }
        lVar10 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        do {
          lVar9 = lVar10;
          dVar2 = A[lVar9];
          uVar5 = uVar5 - 1;
          if (dVar1 < dVar2) break;
          lVar10 = lVar9 + -1;
        } while (lVar3 < lVar9);
        if (dVar1 < dVar2) {
          A[lVar3] = dVar2;
          uVar6 = (ulong)uVar5;
        }
      } while (lVar8 < lVar9);
      uVar5 = (uint)uVar6;
      A[(int)uVar5] = dVar1;
      if (uVar5 == k) {
        return dVar1;
      }
      iVar7 = uVar5 + 1;
      n = n - iVar7;
      if (k < (int)uVar5) {
        iVar7 = 0;
        n = uVar5;
      }
      A = A + iVar7;
      k = k - iVar7;
    } while (1 < n);
  }
  return *A;
}

Assistant:

double dqselect(int n, double A[], int k)
{
    register int i, j, p;
    register double val;

    k = SUPERLU_MAX(k, 0);
    k = SUPERLU_MIN(k, n - 1);
    while (n > 1)
    {
	i = 0; j = n-1;
	p = j; val = A[p];
	while (i < j)
	{
	    for (; A[i] >= val && i < p; i++);
	    if (A[i] < val) { A[p] = A[i]; p = i; }
	    for (; A[j] <= val && j > p; j--);
	    if (A[j] > val) { A[p] = A[j]; p = j; }
	}
	A[p] = val;
	if (p == k) return val;
	else if (p > k) n = p;
	else
	{
	    p++;
	    n -= p; A += p; k -= p;
	}
    }

    return A[0];
}